

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckExpectationTypes
          (ScriptValidator *this,Location *loc,TypeVector *result_types,Expectation *expect,
          char *desc)

{
  size_t *psVar1;
  pointer pCVar2;
  long lVar3;
  size_t *psVar4;
  size_t *psVar5;
  pointer pCVar6;
  size_t *psVar7;
  byte bVar8;
  ConstVector local_a8;
  TypeVector *local_88;
  size_t local_80 [10];
  
  bVar8 = 0;
  if (*(int *)(expect + 0x40) == 1) {
    psVar7 = *(size_t **)(expect + 0x28);
    psVar1 = *(size_t **)(expect + 0x30);
    if (psVar7 != psVar1) {
      local_88 = result_types;
      do {
        psVar4 = psVar7;
        psVar5 = local_80;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          *psVar5 = *psVar4;
          psVar4 = psVar4 + (ulong)bVar8 * -2 + 1;
          psVar5 = psVar5 + (ulong)bVar8 * -2 + 1;
        }
        local_a8.super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pCVar2 = (pointer)operator_new(0x50);
        local_a8.super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar2 + 1;
        psVar4 = local_80;
        pCVar6 = pCVar2;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pCVar6->loc).filename._M_len = *psVar4;
          psVar4 = psVar4 + (ulong)bVar8 * -2 + 1;
          pCVar6 = (pointer)((long)pCVar6 + (ulong)bVar8 * -0x10 + 8);
        }
        local_a8.super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
        super__Vector_impl_data._M_start = pCVar2;
        local_a8.super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_a8.super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
             super__Vector_impl_data._M_finish;
        CheckExpectation(this,loc,local_88,&local_a8,desc);
        operator_delete(pCVar2,0x50);
        psVar7 = psVar7 + 10;
      } while (psVar7 != psVar1);
    }
  }
  else if (*(int *)(expect + 0x40) == 0) {
    CheckExpectation(this,loc,result_types,(ConstVector *)(expect + 0x28),desc);
    return;
  }
  return;
}

Assistant:

void ScriptValidator::CheckExpectation(const Location* loc,
                                       const TypeVector& result_types,
                                       const ConstVector& expected,
                                       const char* desc) {
  // Here we take the concrete expected output types verify those actains
  // the types that are the result of the action.
  TypeVector actual_types;
  for (auto ex : expected) {
    actual_types.push_back(ex.type());
  }
  CheckResultTypes(loc, actual_types, result_types, desc);
}